

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int flags,
                     sqlite3_blob **ppBlob)

{
  short sVar1;
  Schema *pSVar2;
  Op *pOVar3;
  uint p2;
  char *p;
  sqlite_int64 iRow_00;
  int iVar4;
  int addr;
  Incrblob *p_00;
  Parse *pParse;
  Table *pTVar5;
  Index *pIVar6;
  Vdbe *p_01;
  FKey *pFVar7;
  Schema **ppSVar8;
  long lVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int p1;
  Column *pCVar14;
  char *local_a8;
  Table *local_a0;
  int local_94;
  int *local_90;
  Parse *local_88;
  Incrblob *local_80;
  uint local_78;
  uint local_74;
  sqlite3 *local_70;
  ulong local_68;
  char *local_60;
  char *local_58;
  ulong local_50;
  char **local_48;
  sqlite_int64 local_40;
  char *local_38;
  
  local_a8 = (char *)0x0;
  *ppBlob = (sqlite3_blob *)0x0;
  local_94 = flags;
  local_60 = zTable;
  local_58 = zColumn;
  local_40 = iRow;
  local_38 = zDb;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  p_00 = (Incrblob *)sqlite3DbMallocRaw(db,0x28);
  if (p_00 == (Incrblob *)0x0) {
LAB_00114788:
    pParse = (Parse *)0x0;
LAB_0011478b:
    uVar12 = 0;
    if (db->mallocFailed == '\0') {
      *ppBlob = (sqlite3_blob *)p_00;
      pcVar10 = "%s";
      if (local_a8 == (char *)0x0) {
        pcVar10 = (char *)0x0;
      }
      uVar12 = 0;
      goto LAB_00114888;
    }
LAB_001147f7:
    if (p_00 != (Incrblob *)0x0) goto LAB_00114857;
  }
  else {
    p_00->pCsr = (BtCursor *)0x0;
    p_00->pStmt = (sqlite3_stmt *)0x0;
    p_00->flags = 0;
    p_00->nByte = 0;
    p_00->iOffset = 0;
    p_00->iCol = 0;
    p_00->db = (sqlite3 *)0x0;
    pParse = (Parse *)sqlite3DbMallocRaw(db,0x288);
    if (pParse == (Parse *)0x0) goto LAB_00114788;
    local_68 = 0;
    p2 = (uint)(flags != 0);
    local_78 = local_94 != 0 ^ 3;
    local_50 = (ulong)(local_94 != 0 | 2);
    local_48 = &pParse->zErrMsg;
    uVar11 = 0;
    local_88 = pParse;
    local_80 = p_00;
    local_70 = db;
    do {
      memset(local_48,0,0x280);
      pParse->db = db;
      sqlite3DbFree(db,local_a8);
      local_a8 = (char *)0x0;
      sqlite3BtreeEnterAll(db);
      pTVar5 = sqlite3LocateTable(pParse,0,local_60,local_38);
      if (pTVar5 == (Table *)0x0) {
LAB_00114828:
        if (pParse->zErrMsg != (char *)0x0) {
          sqlite3DbFree(db,(void *)0x0);
          local_a8 = pParse->zErrMsg;
          pParse->zErrMsg = (char *)0x0;
        }
        sqlite3BtreeLeaveAll(db);
        uVar12 = 1;
        goto LAB_00114857;
      }
      if ((pTVar5->tabFlags & 0x10) != 0) {
        pcVar10 = "cannot open virtual table: %s";
LAB_00114819:
        sqlite3ErrorMsg(pParse,pcVar10,local_60);
        goto LAB_00114828;
      }
      if ((pTVar5->tabFlags & 0x20) != 0) {
        pcVar10 = "cannot open table without rowid: %s";
        goto LAB_00114819;
      }
      if (pTVar5->pSelect != (Select *)0x0) {
        pcVar10 = "cannot open view: %s";
        goto LAB_00114819;
      }
      sVar1 = pTVar5->nCol;
      local_a0 = pTVar5;
      local_74 = uVar11;
      if (sVar1 < 1) {
        uVar13 = 0;
      }
      else {
        pCVar14 = pTVar5->aCol;
        uVar13 = 0;
        while (iVar4 = sqlite3_stricmp(pCVar14->zName,local_58), iVar4 != 0) {
          uVar13 = uVar13 + 1;
          pCVar14 = pCVar14 + 1;
          if ((uint)(int)sVar1 == uVar13) goto LAB_001147b6;
        }
      }
      db = local_70;
      pParse = local_88;
      uVar11 = (uint)uVar13;
      if (uVar11 == (int)sVar1) {
LAB_001147b6:
        db = local_70;
        sqlite3DbFree(local_70,(void *)0x0);
        local_a8 = sqlite3MPrintf(db,"no such column: \"%s\"",local_58);
        pParse = local_88;
LAB_001147e0:
        sqlite3BtreeLeaveAll(db);
        uVar12 = 1;
        p_00 = local_80;
        goto LAB_001147f7;
      }
      if (local_94 != 0) {
        if ((local_70->flags & 0x80000) == 0) {
          pcVar10 = (char *)0x0;
        }
        else {
          pcVar10 = (char *)0x0;
          for (pFVar7 = local_a0->pFKey; pFVar7 != (FKey *)0x0; pFVar7 = pFVar7->pNextFrom) {
            if (0 < (long)pFVar7->nCol) {
              lVar9 = 0;
              do {
                if (*(uint *)((long)&pFVar7->aCol[0].iFrom + lVar9) == uVar11) {
                  pcVar10 = "foreign key";
                }
                lVar9 = lVar9 + 0x10;
              } while ((long)pFVar7->nCol * 0x10 != lVar9);
            }
          }
        }
        for (pIVar6 = local_a0->pIndex; pIVar6 != (Index *)0x0; pIVar6 = pIVar6->pNext) {
          if ((ulong)pIVar6->nKeyCol != 0) {
            uVar13 = 0;
            do {
              if (uVar11 == (int)pIVar6->aiColumn[uVar13]) {
                pcVar10 = "indexed";
              }
              uVar13 = uVar13 + 1;
            } while (pIVar6->nKeyCol != uVar13);
          }
        }
        if (pcVar10 != (char *)0x0) {
          sqlite3DbFree(local_70,(void *)0x0);
          local_a8 = sqlite3MPrintf(db,"cannot open %s column for writing",pcVar10);
          goto LAB_001147e0;
        }
      }
      p_01 = sqlite3VdbeCreate(local_88);
      local_80->pStmt = (sqlite3_stmt *)p_01;
      if (p_01 != (Vdbe *)0x0) {
        pSVar2 = local_a0->pSchema;
        if (pSVar2 == (Schema *)0x0) {
          uVar13 = 0xfff0bdc0;
        }
        else {
          uVar12 = db->nDb;
          if ((int)uVar12 < 1) {
            uVar13 = 0;
          }
          else {
            ppSVar8 = &db->aDb->pSchema;
            uVar13 = 0;
            do {
              if (*ppSVar8 == pSVar2) goto LAB_00114590;
              uVar13 = uVar13 + 1;
              ppSVar8 = ppSVar8 + 4;
            } while (uVar12 != uVar13);
            uVar13 = (ulong)uVar12;
          }
        }
LAB_00114590:
        local_90 = (int *)(long)pSVar2->iGeneration;
        p1 = (int)uVar13;
        addr = sqlite3VdbeAddOp3(p_01,4,p1,p2,pSVar2->schema_cookie);
        iVar4 = -0xe;
        sqlite3VdbeChangeP4(p_01,addr,(char *)local_90,-0xe);
        if (p_01->aOp != (Op *)0x0) {
          iVar4 = p_01->nOp * 3;
          p_01->aOp[(long)p_01->nOp + -1].p5 = '\x01';
        }
        sqlite3VdbeAddOpList(p_01,10,sqlite3_blob_open::openBlob,iVar4);
        uVar12 = 1 << ((byte)uVar13 & 0x1f);
        p_01->btreeMask = p_01->btreeMask | uVar12;
        if ((p1 != 1) && ((p_01->db->aDb[p1].pBt)->sharable != '\0')) {
          p_01->lockMask = p_01->lockMask | uVar12;
        }
        if (1 < (uint)p_01->nOp) {
          pOVar3 = p_01->aOp;
          pOVar3[1].p1 = p1;
          pOVar3[1].p2 = local_a0->tnum;
          pOVar3[1].p3 = p2;
        }
        local_90 = &local_a0->tnum;
        sqlite3VdbeChangeP4(p_01,1,local_a0->zName,0);
        sqlite3VdbeChangeToNoop(p_01,local_78);
        pTVar5 = local_a0;
        if ((uint)local_50 < (uint)p_01->nOp) {
          pOVar3 = p_01->aOp;
          pOVar3[local_50].p2 = *local_90;
          pOVar3[local_50].p3 = p1;
        }
        sqlite3VdbeChangeP4(p_01,(uint)local_50,(char *)((long)local_a0->nCol + 1),-0xe);
        pParse = local_88;
        if (6 < (uint)p_01->nOp) {
          p_01->aOp[6].p2 = (int)pTVar5->nCol;
        }
        if (db->mallocFailed == '\0') {
          local_88->nVar = 1;
          local_88->nTab = 1;
          local_88->nMem = 1;
          sqlite3VdbeMakeReady(p_01,local_88);
        }
      }
      p_00 = local_80;
      local_80->flags = p2;
      local_80->iCol = uVar11;
      local_80->db = db;
      sqlite3BtreeLeaveAll(db);
      iRow_00 = local_40;
      uVar12 = local_74;
      if (db->mallocFailed != '\0') break;
      sqlite3_bind_int64(p_00->pStmt,1,local_40);
      uVar12 = blobSeekToRow(p_00,iRow_00,&local_a8);
      if (0x30 < (uint)local_68) break;
      local_68 = (ulong)((uint)local_68 + 1);
      uVar11 = 0x11;
    } while (uVar12 == 0x11);
    if (uVar12 == 0) goto LAB_0011478b;
LAB_00114857:
    if ((Vdbe *)p_00->pStmt != (Vdbe *)0x0) {
      sqlite3VdbeFinalize((Vdbe *)p_00->pStmt);
    }
  }
  sqlite3DbFree(db,p_00);
  pcVar10 = "%s";
  if (local_a8 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
LAB_00114888:
  p = local_a8;
  sqlite3ErrorWithMsg(db,uVar12,pcVar10,local_a8);
  sqlite3DbFree(db,p);
  sqlite3ParserReset(pParse);
  sqlite3DbFree(db,pParse);
  if (db == (sqlite3 *)0x0) {
    uVar12 = uVar12 & 0xff;
  }
  else if ((uVar12 == 0xc0a) || (db->mallocFailed != '\0')) {
    apiOomError(db);
    uVar12 = 7;
  }
  else {
    uVar12 = uVar12 & db->errMask;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return uVar12;
}

Assistant:

SQLITE_STDCALL sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int flags,              /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */

  /* This VDBE program seeks a btree cursor to the identified 
  ** db/table/row entry. The reason for using a vdbe program instead
  ** of writing code to use the b-tree layer directly is that the
  ** vdbe program will take advantage of the various transaction,
  ** locking and error handling infrastructure built into the vdbe.
  **
  ** After seeking the cursor, the vdbe executes an OP_ResultRow.
  ** Code external to the Vdbe then "borrows" the b-tree cursor and
  ** uses it to implement the blob_read(), blob_write() and 
  ** blob_bytes() functions.
  **
  ** The sqlite3_blob_close() function finalizes the vdbe program,
  ** which closes the b-tree cursor and (possibly) commits the 
  ** transaction.
  */
  static const int iLn = VDBE_OFFSET_LINENO(4);
  static const VdbeOpList openBlob[] = {
    /* {OP_Transaction, 0, 0, 0},  // 0: Inserted separately */
    {OP_TableLock, 0, 0, 0},       /* 1: Acquire a read or write lock */
    /* One of the following two instructions is replaced by an OP_Noop. */
    {OP_OpenRead, 0, 0, 0},        /* 2: Open cursor 0 for reading */
    {OP_OpenWrite, 0, 0, 0},       /* 3: Open cursor 0 for read/write */
    {OP_Variable, 1, 1, 1},        /* 4: Push the rowid to the stack */
    {OP_NotExists, 0, 10, 1},      /* 5: Seek the cursor */
    {OP_Column, 0, 0, 1},          /* 6  */
    {OP_ResultRow, 1, 0, 0},       /* 7  */
    {OP_Goto, 0, 4, 0},            /* 8  */
    {OP_Close, 0, 0, 0},           /* 9  */
    {OP_Halt, 0, 0, 0},            /* 10 */
  };

  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Parse *pParse = 0;
  Incrblob *pBlob = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppBlob==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  *ppBlob = 0;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  flags = !!flags;                /* flags = (flags ? 1 : 0); */

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  if( !pBlob ) goto blob_open_out;
  pParse = sqlite3StackAllocRaw(db, sizeof(*pParse));
  if( !pParse ) goto blob_open_out;

  do {
    memset(pParse, 0, sizeof(Parse));
    pParse->db = db;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(pParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open virtual table: %s", zTable);
    }
    if( pTab && !HasRowid(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open table without rowid: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && pTab->pSelect ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( pParse->zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = pParse->zErrMsg;
        pParse->zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key. 
    ** It is against the rules to open a column to which either of these
    ** descriptions applies for writing.  */
    if( flags ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this 
        ** case.  */
        FKey *pFKey;
        for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nKeyCol; j++){
          if( pIdx->aiColumn[j]==iCol ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(pParse);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);


      sqlite3VdbeAddOp4Int(v, OP_Transaction, iDb, flags, 
                           pTab->pSchema->schema_cookie,
                           pTab->pSchema->iGeneration);
      sqlite3VdbeChangeP5(v, 1);     
      sqlite3VdbeAddOpList(v, ArraySize(openBlob), openBlob, iLn);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb); 

      /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
      sqlite3VdbeChangeToNoop(v, 1);
#else
      sqlite3VdbeChangeP1(v, 1, iDb);
      sqlite3VdbeChangeP2(v, 1, pTab->tnum);
      sqlite3VdbeChangeP3(v, 1, flags);
      sqlite3VdbeChangeP4(v, 1, pTab->zName, P4_TRANSIENT);
#endif

      /* Remove either the OP_OpenWrite or OpenRead. Set the P2 
      ** parameter of the other to pTab->tnum.  */
      sqlite3VdbeChangeToNoop(v, 3 - flags);
      sqlite3VdbeChangeP2(v, 2 + flags, pTab->tnum);
      sqlite3VdbeChangeP3(v, 2 + flags, iDb);

      /* Configure the number of columns. Configure the cursor to
      ** think that the table has one more column than it really
      ** does. An OP_Column to retrieve this imaginary column will
      ** always return an SQL NULL. This is useful because it means
      ** we can invoke OP_Column to fill in the vdbe cursors type 
      ** and offset cache without causing any IO.
      */
      sqlite3VdbeChangeP4(v, 2+flags, SQLITE_INT_TO_PTR(pTab->nCol+1),P4_INT32);
      sqlite3VdbeChangeP2(v, 6, pTab->nCol);
      if( !db->mallocFailed ){
        pParse->nVar = 1;
        pParse->nMem = 1;
        pParse->nTab = 1;
        sqlite3VdbeMakeReady(v, pParse);
      }
    }
   
    pBlob->flags = flags;
    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    sqlite3_bind_int64(pBlob->pStmt, 1, iRow);
    rc = blobSeekToRow(pBlob, iRow, &zErr);
  } while( (++nAttempt)<SQLITE_MAX_SCHEMA_RETRY && rc==SQLITE_SCHEMA );

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : 0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3ParserReset(pParse);
  sqlite3StackFree(db, pParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}